

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessageCommand.cxx
# Opt level: O3

bool __thiscall
cmMessageCommand::InitialPass
          (cmMessageCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  pointer pbVar2;
  cmMakefile *pcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  cmake *pcVar8;
  cmMessenger *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  string message;
  MessageType local_84;
  bool local_80;
  int local_7c;
  long local_78;
  string local_70;
  string local_50;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar1 == pbVar2) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_002ec25e;
  }
  else {
    iVar7 = std::__cxx11::string::compare((char *)pbVar1);
    if (iVar7 == 0) {
      local_84 = FATAL_ERROR;
      local_80 = false;
LAB_002ec137:
      local_7c = 1;
LAB_002ec13f:
      local_78 = 0x20;
      bVar4 = false;
      bVar6 = false;
    }
    else {
      iVar7 = std::__cxx11::string::compare((char *)pbVar1);
      if (iVar7 == 0) {
        local_84 = FATAL_ERROR;
        local_80 = true;
        goto LAB_002ec137;
      }
      iVar7 = std::__cxx11::string::compare((char *)pbVar1);
      if (iVar7 == 0) {
        local_7c = 2;
        local_84 = WARNING;
        local_80 = false;
        goto LAB_002ec13f;
      }
      iVar7 = std::__cxx11::string::compare((char *)pbVar1);
      if (iVar7 == 0) {
        local_7c = 2;
        local_78 = 0x20;
        pcVar3 = (this->super_cmCommand).Makefile;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"CMAKE_SUPPRESS_DEVELOPER_ERRORS","");
        bVar5 = cmMakefile::IsSet(pcVar3,&local_70);
        if (bVar5) {
          pcVar3 = (this->super_cmCommand).Makefile;
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,"CMAKE_SUPPRESS_DEVELOPER_ERRORS","");
          local_80 = cmMakefile::IsOn(pcVar3,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          local_80 = !local_80;
        }
        else {
          local_80 = false;
        }
        paVar9 = &local_70.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar9) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if (local_80 == false) {
          pcVar3 = (this->super_cmCommand).Makefile;
          local_70._M_dataplus._M_p = (pointer)paVar9;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_70,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS","");
          bVar5 = cmMakefile::IsOn(pcVar3,&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != paVar9) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          bVar4 = false;
          bVar6 = false;
          local_84 = AUTHOR_WARNING;
          if (bVar5) goto LAB_002ec25e;
        }
        else {
          local_7c = 1;
          bVar4 = false;
          bVar6 = false;
          local_84 = AUTHOR_ERROR;
        }
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)pbVar1);
        bVar6 = true;
        if (iVar7 == 0) {
          local_84 = MESSAGE;
          local_78 = 0x20;
          local_80 = false;
          bVar4 = true;
          local_7c = 4;
        }
        else {
          iVar7 = std::__cxx11::string::compare((char *)pbVar1);
          if (iVar7 == 0) {
            local_7c = 5;
          }
          else {
            iVar7 = std::__cxx11::string::compare((char *)pbVar1);
            if (iVar7 == 0) {
              local_7c = 6;
            }
            else {
              iVar7 = std::__cxx11::string::compare((char *)pbVar1);
              if (iVar7 != 0) {
                iVar7 = std::__cxx11::string::compare((char *)pbVar1);
                if (iVar7 == 0) {
                  local_7c = 2;
                  pcVar3 = (this->super_cmCommand).Makefile;
                  paVar9 = &local_70.field_2;
                  local_70._M_dataplus._M_p = (pointer)paVar9;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_70,"CMAKE_ERROR_DEPRECATED","");
                  local_80 = cmMakefile::IsOn(pcVar3,&local_70);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_70._M_dataplus._M_p != paVar9) {
                    operator_delete(local_70._M_dataplus._M_p,
                                    local_70.field_2._M_allocated_capacity + 1);
                  }
                  if (local_80) {
                    local_84 = DEPRECATION_ERROR;
                    goto LAB_002ec137;
                  }
                  pcVar3 = (this->super_cmCommand).Makefile;
                  local_70._M_dataplus._M_p = (pointer)paVar9;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_70,"CMAKE_WARN_DEPRECATED","");
                  bVar5 = cmMakefile::IsSet(pcVar3,&local_70);
                  bVar6 = true;
                  if (bVar5) {
                    pcVar3 = (this->super_cmCommand).Makefile;
                    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_50,"CMAKE_WARN_DEPRECATED","");
                    bVar6 = cmMakefile::IsOn(pcVar3,&local_50);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_50._M_dataplus._M_p != &local_50.field_2) {
                      operator_delete(local_50._M_dataplus._M_p,
                                      local_50.field_2._M_allocated_capacity + 1);
                    }
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_70._M_dataplus._M_p != paVar9) {
                    operator_delete(local_70._M_dataplus._M_p,
                                    local_70.field_2._M_allocated_capacity + 1);
                  }
                  if (bVar6 == false) goto LAB_002ec25e;
                  local_84 = DEPRECATION_WARNING;
                  goto LAB_002ec13f;
                }
                local_84 = MESSAGE;
                iVar7 = std::__cxx11::string::compare((char *)pbVar1);
                local_78 = (ulong)(iVar7 == 0) << 5;
                local_7c = 3;
                bVar4 = false;
                local_80 = false;
                goto LAB_002ec141;
              }
              local_7c = 7;
            }
          }
          local_78 = 0x20;
          local_84 = MESSAGE;
          local_80 = false;
          bVar4 = true;
        }
      }
    }
LAB_002ec141:
    pcVar8 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
    if (pcVar8->MessageLogLevel == LOG_UNDEFINED) {
      __assert_fail("\"Expected a valid log level here\" && desiredLevel != cmake::LogLevel::LOG_UNDEFINED"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmMessageCommand.cxx"
                    ,99,
                    "virtual bool cmMessageCommand::InitialPass(const std::vector<std::string> &, cmExecutionStatus &)"
                   );
    }
    if ((int)pcVar8->MessageLogLevel < local_7c) goto LAB_002ec25e;
    local_50._M_dataplus._M_p = (pointer)((long)&(pbVar1->_M_dataplus)._M_p + local_78);
    local_50._M_string_length =
         (size_type)
         (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (&local_70,
               (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)&local_50,"");
    if (bVar6) {
      if (bVar4) {
        cmMakefile::DisplayStatus((this->super_cmCommand).Makefile,&local_70,-1.0);
      }
      else {
        cmSystemTools::Message(&local_70,(char *)0x0);
      }
    }
    else {
      this_00 = cmMakefile::GetMessenger((this->super_cmCommand).Makefile);
      cmMakefile::GetBacktrace((this->super_cmCommand).Makefile);
      cmMessenger::DisplayMessage(this_00,local_84,&local_70,(cmListFileBacktrace *)&local_50);
      if ((pointer)local_50._M_string_length != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length);
      }
    }
    if (local_80 != false) {
      cmSystemTools::s_FatalErrorOccured = true;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_002ec25e;
  }
  operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
LAB_002ec25e:
  return pbVar1 != pbVar2;
}

Assistant:

bool cmMessageCommand::InitialPass(std::vector<std::string> const& args,
                                   cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  auto i = args.cbegin();

  auto type = MessageType::MESSAGE;
  auto status = false;
  auto fatal = false;
  auto level = cmake::LogLevel::LOG_UNDEFINED;
  if (*i == "SEND_ERROR") {
    type = MessageType::FATAL_ERROR;
    level = cmake::LogLevel::LOG_ERROR;
    ++i;
  } else if (*i == "FATAL_ERROR") {
    fatal = true;
    type = MessageType::FATAL_ERROR;
    level = cmake::LogLevel::LOG_ERROR;
    ++i;
  } else if (*i == "WARNING") {
    type = MessageType::WARNING;
    level = cmake::LogLevel::LOG_WARNING;
    ++i;
  } else if (*i == "AUTHOR_WARNING") {
    if (this->Makefile->IsSet("CMAKE_SUPPRESS_DEVELOPER_ERRORS") &&
        !this->Makefile->IsOn("CMAKE_SUPPRESS_DEVELOPER_ERRORS")) {
      fatal = true;
      type = MessageType::AUTHOR_ERROR;
      level = cmake::LogLevel::LOG_ERROR;
    } else if (!this->Makefile->IsOn("CMAKE_SUPPRESS_DEVELOPER_WARNINGS")) {
      type = MessageType::AUTHOR_WARNING;
      level = cmake::LogLevel::LOG_WARNING;
    } else {
      return true;
    }
    ++i;
  } else if (*i == "STATUS") {
    status = true;
    level = cmake::LogLevel::LOG_STATUS;
    ++i;
  } else if (*i == "VERBOSE") {
    status = true;
    level = cmake::LogLevel::LOG_VERBOSE;
    ++i;
  } else if (*i == "DEBUG") {
    status = true;
    level = cmake::LogLevel::LOG_DEBUG;
    ++i;
  } else if (*i == "TRACE") {
    status = true;
    level = cmake::LogLevel::LOG_TRACE;
    ++i;
  } else if (*i == "DEPRECATION") {
    if (this->Makefile->IsOn("CMAKE_ERROR_DEPRECATED")) {
      fatal = true;
      type = MessageType::DEPRECATION_ERROR;
      level = cmake::LogLevel::LOG_ERROR;
    } else if ((!this->Makefile->IsSet("CMAKE_WARN_DEPRECATED") ||
                this->Makefile->IsOn("CMAKE_WARN_DEPRECATED"))) {
      type = MessageType::DEPRECATION_WARNING;
      level = cmake::LogLevel::LOG_WARNING;
    } else {
      return true;
    }
    ++i;
  } else if (*i == "NOTICE") {
    // `NOTICE` message type is going to be output to stderr
    level = cmake::LogLevel::LOG_NOTICE;
    ++i;
  } else {
    // Messages w/o any type are `NOTICE`s
    level = cmake::LogLevel::LOG_NOTICE;
  }
  assert("Message log level expected to be set" &&
         level != cmake::LogLevel::LOG_UNDEFINED);

  auto desiredLevel = this->Makefile->GetCMakeInstance()->GetLogLevel();
  assert("Expected a valid log level here" &&
         desiredLevel != cmake::LogLevel::LOG_UNDEFINED);

  if (desiredLevel < level) {
    // Suppress the message
    return true;
  }

  auto message = cmJoin(cmMakeRange(i, args.cend()), "");

  if (type != MessageType::MESSAGE) {
    // we've overridden the message type, above, so display it directly
    cmMessenger* m = this->Makefile->GetMessenger();
    m->DisplayMessage(type, message, this->Makefile->GetBacktrace());
  } else {
    if (status) {
      this->Makefile->DisplayStatus(message, -1);
    } else {
      cmSystemTools::Message(message);
    }
  }
  if (fatal) {
    cmSystemTools::SetFatalErrorOccured();
  }
  return true;
}